

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

void __thiscall icu_63::TextTrieMap::buildTrie(TextTrieMap *this,UErrorCode *status)

{
  char16_t *pcVar1;
  void *value;
  int index;
  UVector *this_00;
  UnicodeString keyString;
  ConstChar16Ptr local_88;
  char16_t *local_80;
  UnicodeString local_70;
  
  this_00 = this->fLazyContents;
  if (this_00 != (UVector *)0x0) {
    if (0 < this_00->count) {
      index = 0;
      do {
        pcVar1 = (char16_t *)UVector::elementAt(this_00,index);
        value = UVector::elementAt(this->fLazyContents,index + 1);
        local_88.p_ = pcVar1;
        UnicodeString::UnicodeString(&local_70,'\x01',&local_88,-1);
        local_80 = local_88.p_;
        putImpl(this,&local_70,value,status);
        UnicodeString::~UnicodeString(&local_70);
        this_00 = this->fLazyContents;
        index = index + 2;
      } while (index < this_00->count);
    }
    (*(this_00->super_UObject)._vptr_UObject[1])();
    this->fLazyContents = (UVector *)0x0;
  }
  return;
}

Assistant:

void TextTrieMap::buildTrie(UErrorCode &status) {
    if (fLazyContents != NULL) {
        for (int32_t i=0; i<fLazyContents->size(); i+=2) {
            const UChar *key = (UChar *)fLazyContents->elementAt(i);
            void  *val = fLazyContents->elementAt(i+1);
            UnicodeString keyString(TRUE, key, -1);  // Aliasing UnicodeString constructor.
            putImpl(keyString, val, status);
        }
        delete fLazyContents;
        fLazyContents = NULL; 
    }
}